

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O3

void deqp::RobustBufferAccessBehavior::Shader::Compile(Functions *gl,GLuint id)

{
  GLenum GVar1;
  TestError *this;
  GLint length;
  GLint status;
  string message;
  GLint local_48;
  GLint local_44;
  GLchar *local_40;
  undefined8 local_38;
  GLchar local_30 [16];
  
  local_44 = 0;
  (*gl->compileShader)(id);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"CompileShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x224);
  (*gl->getShaderiv)(id,0x8b81,&local_44);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x228);
  if (local_44 == 1) {
    return;
  }
  local_48 = 0;
  local_40 = local_30;
  local_38 = 0;
  local_30[0] = '\0';
  (*gl->getShaderiv)(id,0x8b84,&local_48);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x232);
  std::__cxx11::string::resize((ulong)&local_40,(char)local_48);
  (*gl->getShaderInfoLog)(id,local_48,(GLsizei *)0x0,local_40);
  GVar1 = (*gl->getError)();
  glu::checkError(GVar1,"GetShaderInfoLog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                  ,0x239);
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,local_40,(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
             ,0x23b);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Shader::Compile(const glw::Functions& gl, glw::GLuint id)
{
	GLint status = GL_FALSE;

	/* Compile */
	gl.compileShader(id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CompileShader");

	/* Get compilation status */
	gl.getShaderiv(id, GL_COMPILE_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

	/* Log compilation error */
	if (GL_TRUE != status)
	{
		glw::GLint  length = 0;
		std::string message;

		/* Error log length */
		gl.getShaderiv(id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Prepare storage */
		message.resize(length, 0);

		/* Get error log */
		gl.getShaderInfoLog(id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

		TCU_FAIL(message.c_str());
	}
}